

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O2

field<discordpp::WelcomeScreen> * __thiscall
discordpp::field<discordpp::WelcomeScreen>::operator=
          (field<discordpp::WelcomeScreen> *this,field<discordpp::WelcomeScreen> *f)

{
  _Head_base<0UL,_discordpp::WelcomeScreen_*,_false> _Var1;
  WelcomeScreen *this_00;
  
  _Var1._M_head_impl =
       (f->t_)._M_t.
       super___uniq_ptr_impl<discordpp::WelcomeScreen,_std::default_delete<discordpp::WelcomeScreen>_>
       ._M_t.
       super__Tuple_impl<0UL,_discordpp::WelcomeScreen_*,_std::default_delete<discordpp::WelcomeScreen>_>
       .super__Head_base<0UL,_discordpp::WelcomeScreen_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (WelcomeScreen *)0x0) {
    this_00 = (pointer)0x0;
  }
  else {
    this_00 = (WelcomeScreen *)operator_new(0x28);
    WelcomeScreen::WelcomeScreen(this_00,_Var1._M_head_impl);
  }
  std::__uniq_ptr_impl<discordpp::WelcomeScreen,_std::default_delete<discordpp::WelcomeScreen>_>::
  reset((__uniq_ptr_impl<discordpp::WelcomeScreen,_std::default_delete<discordpp::WelcomeScreen>_> *
        )this,this_00);
  this->s_ = present_e;
  return this;
}

Assistant:

field<T> &operator=(const field<T> &f) {
        t_.reset(f.t_ ? new T(*f.t_) : nullptr);
        s_ = present_e;
        return *this;
    }